

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any_executor.hpp
# Opt level: O3

void __thiscall
asio::execution::detail::any_executor_base::
execute<asio::detail::binder0<asio::detail::binder1<std::function<void(std::error_code_const&)>,std::error_code>>>
          (any_executor_base *this,
          binder0<asio::detail::binder1<std::function<void_(const_std::error_code_&)>,_std::error_code>_>
          *f)

{
  code *UNRECOVERED_JUMPTABLE;
  _Manager_type p_Var1;
  undefined8 *puVar2;
  non_const_lvalue<asio::detail::binder0<asio::detail::binder1<std::function<void_(const_std::error_code_&)>,_std::error_code>_>_>
  f2;
  bad_executor ex;
  allocator<void> local_51;
  executor_function local_50;
  _Any_data local_48;
  _Manager_type local_38;
  _Invoker_type local_30;
  undefined8 local_28;
  error_category *peStack_20;
  
  if (this->target_fns_ == (target_fns *)0x0) {
    local_50.impl_ = (impl_base *)&PTR__exception_005547c8;
    puVar2 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar2 = &PTR__exception_005547c8;
    __cxa_throw(puVar2,&bad_executor::typeinfo,std::exception::~exception);
  }
  UNRECOVERED_JUMPTABLE = *(code **)(*(long *)&this[1].object_ + 0x18);
  if (UNRECOVERED_JUMPTABLE != (code *)0x0) {
    (*UNRECOVERED_JUMPTABLE)
              (this,asio::detail::executor_function_view::
                    complete<asio::detail::binder0<asio::detail::binder1<std::function<void(std::error_code_const&)>,std::error_code>>>
              );
    return;
  }
  UNRECOVERED_JUMPTABLE = *(code **)(*(long *)&this[1].object_ + 0x10);
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  local_38 = (_Manager_type)0x0;
  local_30 = (f->handler_).handler_._M_invoker;
  p_Var1 = (f->handler_).handler_.super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    local_48._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&(f->handler_).handler_.super__Function_base._M_functor;
    local_48._8_8_ =
         *(undefined8 *)((long)&(f->handler_).handler_.super__Function_base._M_functor + 8);
    (f->handler_).handler_.super__Function_base._M_manager = (_Manager_type)0x0;
    (f->handler_).handler_._M_invoker = (_Invoker_type)0x0;
    local_38 = p_Var1;
  }
  local_28 = *(undefined8 *)&(f->handler_).arg1_;
  peStack_20 = (f->handler_).arg1_._M_cat;
  asio::detail::executor_function::
  executor_function<asio::detail::binder0<asio::detail::binder1<std::function<void(std::error_code_const&)>,std::error_code>>,std::allocator<void>>
            (&local_50,
             (binder0<asio::detail::binder1<std::function<void_(const_std::error_code_&)>,_std::error_code>_>
              *)&local_48,&local_51);
  (*UNRECOVERED_JUMPTABLE)(this,&local_50);
  if (local_50.impl_ != (impl_base *)0x0) {
    (*(local_50.impl_)->complete_)(local_50.impl_,false);
  }
  if (local_38 != (_Manager_type)0x0) {
    (*local_38)((_Any_data *)&local_48,(_Any_data *)&local_48,__destroy_functor);
  }
  return;
}

Assistant:

void execute(F&& f) const
  {
    if (target_)
    {
      if (target_fns_->blocking_execute != 0)
      {
        asio::detail::non_const_lvalue<F> f2(f);
        target_fns_->blocking_execute(*this, function_view(f2.value));
      }
      else
      {
        target_fns_->execute(*this,
            function(static_cast<F&&>(f), std::allocator<void>()));
      }
    }
    else
    {
      bad_executor ex;
      asio::detail::throw_exception(ex);
    }
  }